

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

QGraphicsItem * __thiscall
QGraphicsItem::commonAncestorItem(QGraphicsItem *this,QGraphicsItem *other)

{
  QGraphicsItemPrivate *pQVar1;
  QGraphicsItem *in_RSI;
  QGraphicsItem *in_RDI;
  int otherDepth;
  int thisDepth;
  QGraphicsItem *otherw;
  QGraphicsItem *thisw;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  int local_30;
  int local_2c;
  QGraphicsItem *local_28;
  QGraphicsItem *local_20;
  QGraphicsItem *local_8;
  
  if (in_RSI == (QGraphicsItem *)0x0) {
    local_8 = (QGraphicsItem *)0x0;
  }
  else {
    local_8 = in_RDI;
    if (in_RSI != in_RDI) {
      QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
                (&in_RDI->d_ptr);
      local_2c = QGraphicsItemPrivate::depth
                           ((QGraphicsItemPrivate *)
                            CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
      QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
                (&in_RSI->d_ptr);
      local_30 = QGraphicsItemPrivate::depth
                           ((QGraphicsItemPrivate *)
                            CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
      local_20 = in_RDI;
      for (; local_28 = in_RSI, local_30 < local_2c; local_2c = local_2c + -1) {
        pQVar1 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                 ::operator->(&local_20->d_ptr);
        local_20 = pQVar1->parent;
      }
      for (; local_2c < local_30; local_30 = local_30 + -1) {
        pQVar1 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                 ::operator->(&local_28->d_ptr);
        local_28 = pQVar1->parent;
      }
      while (local_20 != (QGraphicsItem *)0x0 && local_20 != local_28) {
        pQVar1 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                 ::operator->(&local_20->d_ptr);
        local_20 = pQVar1->parent;
        pQVar1 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                 ::operator->(&local_28->d_ptr);
        local_28 = pQVar1->parent;
      }
      local_8 = local_20;
    }
  }
  return local_8;
}

Assistant:

QGraphicsItem *QGraphicsItem::commonAncestorItem(const QGraphicsItem *other) const
{
    if (!other)
        return nullptr;
    if (other == this)
        return const_cast<QGraphicsItem *>(this);
    const QGraphicsItem *thisw = this;
    const QGraphicsItem *otherw = other;
    int thisDepth = d_ptr->depth();
    int otherDepth = other->d_ptr->depth();
    while (thisDepth > otherDepth) {
        thisw = thisw->d_ptr->parent;
        --thisDepth;
    }
    while (otherDepth > thisDepth) {
        otherw = otherw->d_ptr->parent;
        --otherDepth;
    }
    while (thisw && thisw != otherw) {
        thisw = thisw->d_ptr->parent;
        otherw = otherw->d_ptr->parent;
    }
    return const_cast<QGraphicsItem *>(thisw);
}